

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

fio_sha2_s * fio_sha2_init(fio_sha2_s *__return_storage_ptr__,fio_sha2_variant_e variant)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  
  switch(variant) {
  case SHA_512:
    memset(__return_storage_ptr__,0,0x90);
    (__return_storage_ptr__->digest).i64[0] = 0x6a09e667f3bcc908;
    (__return_storage_ptr__->digest).i64[1] = 0xbb67ae8584caa73b;
    (__return_storage_ptr__->digest).i64[2] = 0x3c6ef372fe94f82b;
    (__return_storage_ptr__->digest).i64[3] = 0xa54ff53a5f1d36f1;
    (__return_storage_ptr__->digest).i64[4] = 0x510e527fade682d1;
    (__return_storage_ptr__->digest).i64[5] = 0x9b05688c2b3e6c1f;
    uVar1 = 0xfb41bd6b;
    uVar2 = 0x1f83d9ab;
    uVar3 = 0x137e2179;
    uVar4 = 0x5be0cd19;
    break;
  case SHA_256:
    memset(__return_storage_ptr__,0,0xe0);
    (__return_storage_ptr__->digest).i64[0] = 0xbb67ae856a09e667;
    (__return_storage_ptr__->digest).i64[1] = 0xa54ff53a3c6ef372;
    (__return_storage_ptr__->digest).i64[2] = 0x9b05688c510e527f;
    (__return_storage_ptr__->digest).i64[3] = 0x5be0cd191f83d9ab;
    (__return_storage_ptr__->digest).i64[4] = 0;
    (__return_storage_ptr__->digest).i64[5] = 0;
    uVar1 = 0;
    uVar2 = 0;
    uVar3 = 0;
    uVar4 = 0;
    break;
  case SHA_512_256:
    memset(__return_storage_ptr__,0,0x90);
    (__return_storage_ptr__->digest).i64[0] = 0x22312194fc2bf72c;
    (__return_storage_ptr__->digest).i64[1] = 0x9f555fa3c84c64c2;
    (__return_storage_ptr__->digest).i64[2] = 0x2393b86b6f53b151;
    (__return_storage_ptr__->digest).i64[3] = 0x963877195940eabd;
    (__return_storage_ptr__->digest).i64[4] = 0x96283ee2a88effe3;
    (__return_storage_ptr__->digest).i64[5] = 0xbe5e1e2553863992;
    uVar1 = 0x2c85b8aa;
    uVar2 = 0x2b0199fc;
    uVar3 = 0x81c52ca2;
    uVar4 = 0xeb72ddc;
    break;
  case SHA_224:
    memset(__return_storage_ptr__,0,0xe0);
    (__return_storage_ptr__->digest).i64[0] = 0x367cd507c1059ed8;
    (__return_storage_ptr__->digest).i64[1] = 0xf70e59393070dd17;
    (__return_storage_ptr__->digest).i64[2] = 0x68581511ffc00b31;
    (__return_storage_ptr__->digest).i64[3] = 0xbefa4fa464f98fa7;
    (__return_storage_ptr__->digest).i64[4] = 0;
    (__return_storage_ptr__->digest).i64[5] = 0;
    uVar1 = 0;
    uVar2 = 0;
    uVar3 = 0;
    uVar4 = 0;
    break;
  case SHA_512_224:
    memset(__return_storage_ptr__,0,0x90);
    (__return_storage_ptr__->digest).i64[0] = 0x8c3d37c819544da2;
    (__return_storage_ptr__->digest).i64[1] = 0x73e1996689dcd4d6;
    (__return_storage_ptr__->digest).i64[2] = 0x1dfab7ae32ff9c82;
    (__return_storage_ptr__->digest).i64[3] = 0x679dd514582f9fcf;
    (__return_storage_ptr__->digest).i64[4] = 0xf6d2b697bd44da8;
    (__return_storage_ptr__->digest).i64[5] = 0x77e36f7304c48942;
    uVar1 = 0x6a1d36c8;
    uVar2 = 0x3f9d85a8;
    uVar3 = 0x91d692a1;
    uVar4 = 0x1112e6ad;
    break;
  default:
    if (0 < FIO_LOG_LEVEL) {
      FIO_LOG2STDERR("FATAL: SHA-2 ERROR - variant unknown");
    }
    exit(2);
  case SHA_384:
    memset(__return_storage_ptr__,0,0x90);
    (__return_storage_ptr__->digest).i64[0] = 0xcbbb9d5dc1059ed8;
    (__return_storage_ptr__->digest).i64[1] = 0x629a292a367cd507;
    (__return_storage_ptr__->digest).i64[2] = 0x9159015a3070dd17;
    (__return_storage_ptr__->digest).i64[3] = 0x152fecd8f70e5939;
    (__return_storage_ptr__->digest).i64[4] = 0x67332667ffc00b31;
    (__return_storage_ptr__->digest).i64[5] = 0x8eb44a8768581511;
    uVar1 = 0x64f98fa7;
    uVar2 = 0xdb0c2e0d;
    uVar3 = 0xbefa4fa4;
    uVar4 = 0x47b5481d;
  }
  (__return_storage_ptr__->digest).i32[0xc] = uVar1;
  (__return_storage_ptr__->digest).i32[0xd] = uVar2;
  (__return_storage_ptr__->digest).i32[0xe] = uVar3;
  (__return_storage_ptr__->digest).i32[0xf] = uVar4;
  __return_storage_ptr__->type = variant;
  return __return_storage_ptr__;
}

Assistant:

fio_sha2_s fio_sha2_init(fio_sha2_variant_e variant) {
  if (variant == SHA_256) {
    return (fio_sha2_s){
        .type = SHA_256,
        .digest.i32[0] = 0x6a09e667,
        .digest.i32[1] = 0xbb67ae85,
        .digest.i32[2] = 0x3c6ef372,
        .digest.i32[3] = 0xa54ff53a,
        .digest.i32[4] = 0x510e527f,
        .digest.i32[5] = 0x9b05688c,
        .digest.i32[6] = 0x1f83d9ab,
        .digest.i32[7] = 0x5be0cd19,
    };
  } else if (variant == SHA_384) {
    return (fio_sha2_s){
        .type = SHA_384,
        .digest.i64[0] = 0xcbbb9d5dc1059ed8,
        .digest.i64[1] = 0x629a292a367cd507,
        .digest.i64[2] = 0x9159015a3070dd17,
        .digest.i64[3] = 0x152fecd8f70e5939,
        .digest.i64[4] = 0x67332667ffc00b31,
        .digest.i64[5] = 0x8eb44a8768581511,
        .digest.i64[6] = 0xdb0c2e0d64f98fa7,
        .digest.i64[7] = 0x47b5481dbefa4fa4,
    };
  } else if (variant == SHA_512) {
    return (fio_sha2_s){
        .type = SHA_512,
        .digest.i64[0] = 0x6a09e667f3bcc908,
        .digest.i64[1] = 0xbb67ae8584caa73b,
        .digest.i64[2] = 0x3c6ef372fe94f82b,
        .digest.i64[3] = 0xa54ff53a5f1d36f1,
        .digest.i64[4] = 0x510e527fade682d1,
        .digest.i64[5] = 0x9b05688c2b3e6c1f,
        .digest.i64[6] = 0x1f83d9abfb41bd6b,
        .digest.i64[7] = 0x5be0cd19137e2179,
    };
  } else if (variant == SHA_224) {
    return (fio_sha2_s){
        .type = SHA_224,
        .digest.i32[0] = 0xc1059ed8,
        .digest.i32[1] = 0x367cd507,
        .digest.i32[2] = 0x3070dd17,
        .digest.i32[3] = 0xf70e5939,
        .digest.i32[4] = 0xffc00b31,
        .digest.i32[5] = 0x68581511,
        .digest.i32[6] = 0x64f98fa7,
        .digest.i32[7] = 0xbefa4fa4,
    };
  } else if (variant == SHA_512_224) {
    return (fio_sha2_s){
        .type = SHA_512_224,
        .digest.i64[0] = 0x8c3d37c819544da2,
        .digest.i64[1] = 0x73e1996689dcd4d6,
        .digest.i64[2] = 0x1dfab7ae32ff9c82,
        .digest.i64[3] = 0x679dd514582f9fcf,
        .digest.i64[4] = 0x0f6d2b697bd44da8,
        .digest.i64[5] = 0x77e36f7304c48942,
        .digest.i64[6] = 0x3f9d85a86a1d36c8,
        .digest.i64[7] = 0x1112e6ad91d692a1,
    };
  } else if (variant == SHA_512_256) {
    return (fio_sha2_s){
        .type = SHA_512_256,
        .digest.i64[0] = 0x22312194fc2bf72c,
        .digest.i64[1] = 0x9f555fa3c84c64c2,
        .digest.i64[2] = 0x2393b86b6f53b151,
        .digest.i64[3] = 0x963877195940eabd,
        .digest.i64[4] = 0x96283ee2a88effe3,
        .digest.i64[5] = 0xbe5e1e2553863992,
        .digest.i64[6] = 0x2b0199fc2c85b8aa,
        .digest.i64[7] = 0x0eb72ddc81c52ca2,
    };
  }
  FIO_LOG_FATAL("SHA-2 ERROR - variant unknown");
  exit(2);
}